

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O0

void __thiscall llbuild::basic::StringList::encode(StringList *this,BinaryEncoder *coder)

{
  size_t in_RCX;
  void *in_RDX;
  StringRef local_40;
  BinaryEncoder *local_30;
  BinaryEncoder *coder_local;
  StringList *this_local;
  char *local_18;
  StringRef *local_10;
  
  local_30 = coder;
  coder_local = (BinaryEncoder *)this;
  BinaryEncoder::write(coder,(int)this->size,in_RDX,in_RCX);
  local_18 = this->contents;
  this_local = (StringList *)this->size;
  local_10 = &local_40;
  local_40.Data = local_18;
  local_40.Length = (size_t)this_local;
  BinaryEncoder::writeBytes(local_30,local_40);
  return;
}

Assistant:

void encode(BinaryEncoder& coder) const {
    coder.write(size);
    coder.writeBytes(StringRef(contents, size));
  }